

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::detail::
         stringifyBinaryExpr<std::vector<supermap::KeyValue<supermap::Key<4ul>,supermap::ByteArray<10ul>>,std::allocator<supermap::KeyValue<supermap::Key<4ul>,supermap::ByteArray<10ul>>>>,std::vector<supermap::KeyValue<supermap::Key<4ul>,supermap::ByteArray<10ul>>,std::allocator<supermap::KeyValue<supermap::Key<4ul>,supermap::ByteArray<10ul>>>>>
                   (vector<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_>_>
                    *lhs,char *op,
                   vector<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_>_>
                   *rhs)

{
  String *in_RDI;
  vector<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_>_>
  *in_stack_ffffffffffffff58;
  String *in_stack_ffffffffffffff70;
  String *in_stack_ffffffffffffffa0;
  String *in_stack_ffffffffffffffa8;
  
  toString<std::vector<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_>_>,_true>
            (in_stack_ffffffffffffff58);
  String::String(in_stack_ffffffffffffff70,(char *)in_RDI);
  String::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  toString<std::vector<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_>_>,_true>
            (in_stack_ffffffffffffff58);
  String::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  return in_RDI;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }